

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderScene.cpp
# Opt level: O0

void __thiscall
Assimp::Blender::Structure::Convert<Assimp::Blender::CustomData>
          (Structure *this,CustomData *dest,FileDatabase *db)

{
  element_type *this_00;
  FileDatabase *db_local;
  CustomData *dest_local;
  Structure *this_local;
  
  ReadFieldArray<1,int,42ul>(this,&dest->typemap,"typemap",db);
  ReadField<1,int>(this,&dest->totlayer,"totlayer",db);
  ReadField<1,int>(this,&dest->maxlayer,"maxlayer",db);
  ReadField<1,int>(this,&dest->totsize,"totsize",db);
  ReadFieldPtrVector<1,std::shared_ptr,Assimp::Blender::CustomDataLayer>
            (this,&dest->layers,"*layers",db);
  this_00 = ::std::
            __shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&db->reader);
  StreamReader<true,_true>::IncPtr(this_00,this->size);
  return;
}

Assistant:

void Structure::Convert<CustomData>(
    CustomData& dest,
    const FileDatabase& db
    ) const
{
    ReadFieldArray<ErrorPolicy_Warn>(dest.typemap, "typemap", db);
    ReadField<ErrorPolicy_Warn>(dest.totlayer, "totlayer", db);
    ReadField<ErrorPolicy_Warn>(dest.maxlayer, "maxlayer", db);
    ReadField<ErrorPolicy_Warn>(dest.totsize, "totsize", db);
    ReadFieldPtrVector<ErrorPolicy_Warn>(dest.layers, "*layers", db);

    db.reader->IncPtr(size);
}